

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  String *in_RDI;
  String *unaff_retaddr;
  char *dest_ptr;
  char *dest;
  char *src;
  char *local_20;
  char *local_10;
  String *a_c_str;
  
  a_c_str = in_RDI;
  pcVar2 = String::c_str(in_RDI);
  if (pcVar2 == (char *)0x0) {
    String::operator=(unaff_retaddr,(char *)a_c_str);
  }
  else {
    local_10 = String::c_str(in_RDI);
    sVar3 = String::length(in_RDI);
    pcVar2 = (char *)operator_new__(sVar3 + 1);
    sVar3 = String::length(in_RDI);
    memset(pcVar2,0,sVar3 + 1);
    local_20 = pcVar2;
    while (*local_10 != '\0') {
      *local_20 = *local_10;
      bVar1 = IsPathSeparator(*local_10);
      if (bVar1) {
        while (bVar1 = IsPathSeparator(*local_10), bVar1) {
          local_10 = local_10 + 1;
        }
      }
      else {
        local_10 = local_10 + 1;
      }
      local_20 = local_20 + 1;
    }
    *local_20 = '\0';
    String::operator=(unaff_retaddr,(char *)a_c_str);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
  }
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}